

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          MessageSetFieldSkipper *field_skipper)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  uint32 uVar9;
  string message_data;
  string temp;
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  string local_d0;
  undefined1 local_b0 [28];
  undefined8 local_94;
  undefined2 local_8c;
  int local_88;
  undefined8 local_84;
  int local_7c;
  int local_78;
  bool local_74;
  DescriptorPool *local_70;
  MessageFactory *pMStack_68;
  CodedOutputStream local_60;
  StringOutputStream local_40;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  uVar5 = 0;
LAB_005a6fc7:
  do {
LAB_005a6fcf:
    pbVar7 = input->buffer_;
    if (pbVar7 < input->buffer_end_) {
      uVar4 = (uint)*pbVar7;
      if ((char)*pbVar7 < '\0') goto LAB_005a6fe9;
      input->buffer_ = pbVar7 + 1;
    }
    else {
      uVar4 = 0;
LAB_005a6fe9:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    }
    if ((int)uVar4 < 0x1a) {
      if (uVar4 == 0) goto LAB_005a727d;
      if (uVar4 == 0xc) {
        uVar5 = 1;
        goto LAB_005a727f;
      }
      if (uVar4 != 0x10) goto LAB_005a702d;
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (ulong)bVar1;
        uVar9 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_005a709b;
        input->buffer_ = pbVar7 + 1;
      }
      else {
        uVar9 = 0;
LAB_005a709b:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
        if ((long)uVar5 < 0) goto LAB_005a727d;
      }
      if (local_d0._M_string_length == 0) goto LAB_005a6fc7;
      local_b0._0_8_ = local_d0._M_dataplus._M_p;
      local_b0._24_4_ = (undefined4)local_d0._M_string_length;
      local_b0._8_8_ = local_d0._M_dataplus._M_p + (int)local_b0._24_4_;
      local_b0._16_8_ = (ZeroCopyInputStream *)0x0;
      local_94._0_4_ = 0;
      local_94._4_4_ = 0;
      local_8c._0_1_ = false;
      local_8c._1_1_ = false;
      local_84._0_4_ = 0;
      local_84._4_4_ = 0x7fffffff;
      local_7c = io::CodedInputStream::default_recursion_limit_;
      local_78 = io::CodedInputStream::default_recursion_limit_;
      local_74 = true;
      local_70 = (DescriptorPool *)0x0;
      pMStack_68 = (MessageFactory *)0x0;
      local_88 = local_b0._24_4_;
      bVar3 = ParseField(this,(int)uVar5 * 8 + 2,(CodedInputStream *)local_b0,extension_finder,
                         (FieldSkipper *)field_skipper);
      if (bVar3) {
        local_d0._M_string_length = 0;
        *local_d0._M_dataplus._M_p = '\0';
        io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b0);
        goto LAB_005a6fc7;
      }
      io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_b0);
LAB_005a727d:
      uVar5 = 0;
      goto LAB_005a727f;
    }
    if (uVar4 != 0x1a) {
LAB_005a702d:
      iVar6 = (*(field_skipper->super_UnknownFieldSetFieldSkipper).super_FieldSkipper.
                _vptr_FieldSkipper[2])(field_skipper,input,(ulong)uVar4);
      cVar2 = (char)iVar6;
LAB_005a703b:
      if (cVar2 != '\0') goto LAB_005a6fcf;
      goto LAB_005a727d;
    }
    if ((int)uVar5 != 0) {
      cVar2 = ParseField(this,(int)uVar5 * 8 + 2,input,extension_finder,
                         (FieldSkipper *)field_skipper);
      goto LAB_005a703b;
    }
    local_b0._0_8_ = local_b0 + 0x10;
    local_b0._8_8_ = (uint8 *)0x0;
    local_b0._16_8_ = local_b0._16_8_ & 0xffffffffffffff00;
    pbVar7 = input->buffer_;
    if (pbVar7 < input->buffer_end_) {
      bVar1 = *pbVar7;
      uVar5 = (ulong)bVar1;
      uVar9 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_005a7161;
      input->buffer_ = pbVar7 + 1;
LAB_005a7173:
      uVar4 = (uint)uVar5;
      bVar3 = io::CodedInputStream::ReadString(input,(string *)local_b0,uVar4);
      if (!bVar3) goto LAB_005a71e7;
      io::StringOutputStream::StringOutputStream(&local_40,&local_d0);
      io::CodedOutputStream::CodedOutputStream(&local_60,&local_40.super_ZeroCopyOutputStream);
      if (local_60.buffer_size_ < 5) {
        io::CodedOutputStream::WriteVarint32SlowPath(&local_60,uVar4);
      }
      else {
        pbVar7 = local_60.buffer_;
        if (uVar4 < 0x80) {
          uVar8 = uVar5 & 0xffffffff;
        }
        else {
          uVar8 = uVar5 & 0xffffffff;
          do {
            uVar4 = (uint)uVar5;
            *pbVar7 = (byte)uVar5 | 0x80;
            uVar8 = uVar8 >> 7;
            pbVar7 = pbVar7 + 1;
            uVar5 = uVar8;
          } while (0x3fff < uVar4);
        }
        *pbVar7 = (byte)uVar8;
        iVar6 = ((int)pbVar7 - (int)local_60.buffer_) + 1;
        local_60.buffer_ = local_60.buffer_ + iVar6;
        local_60.buffer_size_ = local_60.buffer_size_ - iVar6;
      }
      io::CodedOutputStream::WriteRaw(&local_60,(void *)local_b0._0_8_,local_b0._8_4_);
      io::CodedOutputStream::~CodedOutputStream(&local_60);
      io::StringOutputStream::~StringOutputStream(&local_40);
      bVar3 = true;
    }
    else {
      uVar9 = 0;
LAB_005a7161:
      uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      if (-1 < (long)uVar5) goto LAB_005a7173;
LAB_005a71e7:
      bVar3 = false;
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
    }
    uVar5 = 0;
    if (!bVar3) {
LAB_005a727f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      return SUB81(uVar5,0);
    }
  } while( true );
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       MessageSetFieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    const uint32 tag = input->ReadTagNoLastTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}